

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O1

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmResourceInfoCommon::GetSizeAuxSurface
          (GmmResourceInfoCommon *this,GMM_UNIFIED_AUX_TYPE GmmAuxType)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  int iVar2;
  GMM_GFX_SIZE_T GVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  switch(GmmAuxType) {
  case GMM_AUX_CCS:
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    if (((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x1f) & 2) != 0) &&
       (((this->Surf).Flags.Gpu.field_0x2 & 0x20) == 0)) goto switchD_001aa616_caseD_2;
    if ((((this->AuxSecSurf).Type != RESOURCE_INVALID) &&
        (aVar1 = (this->Surf).Flags.Gpu, ((ulong)aVar1 & 2) != 0)) &&
       ((((ulong)aVar1 & 0x40) != 0 || (1 < (this->Surf).MSAA.NumSamples)))) goto LAB_001aa63d;
  case GMM_AUX_HIZ:
  case GMM_AUX_MCS:
switchD_001aa616_caseD_6:
    GVar3 = (this->AuxSurf).UnpaddedSize;
    break;
  default:
switchD_001aa616_caseD_2:
    GVar3 = 0;
    break;
  case GMM_AUX_CC:
    if (((ulong)(this->Surf).Flags.Gpu & 0x2000000400) == 0x400) {
      return 8;
    }
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x20) & 4) == 0) {
      return (this->AuxSurf).CCSize;
    }
    if ((this->Surf).MSAA.NumSamples < 2) goto switchD_001aa616_caseD_2;
    goto switchD_001aa616_caseD_6;
  case GMM_AUX_COMP_STATE:
    GVar3 = 0x40;
    break;
  case GMM_AUX_ZCS:
    if (((this->Surf).Flags.Gpu.field_0x4 & 0x20) == 0) {
      return 0;
    }
    if ((this->AuxSecSurf).Type == RESOURCE_INVALID) {
      return 0;
    }
LAB_001aa63d:
    GVar3 = (this->AuxSecSurf).Size;
    break;
  case GMM_AUX_SURF:
    GVar3 = (this->AuxSecSurf).Size + (this->AuxSurf).Size;
  }
  return GVar3;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_GFX_SIZE_T GMM_STDCALL GetSizeAuxSurface(GMM_UNIFIED_AUX_TYPE GmmAuxType)
            {
                if (GmmAuxType == GMM_AUX_SURF)
                {
                    return (AuxSurf.Size + AuxSecSurf.Size);
                }
                else if (GmmAuxType == GMM_AUX_CCS || GmmAuxType == GMM_AUX_HIZ || GmmAuxType == GMM_AUX_MCS)
                {
                    if(GmmAuxType == GMM_AUX_CCS &&
                       GetGmmLibContext()->GetSkuTable().FtrFlatPhysCCS && !Surf.Flags.Gpu.ProceduralTexture)
                    {
                        return 0;
                    }
                    if (GmmAuxType == GMM_AUX_CCS && AuxSecSurf.Type != RESOURCE_INVALID &&
                        (Surf.Flags.Gpu.CCS && (Surf.MSAA.NumSamples > 1 ||
                            Surf.Flags.Gpu.Depth)))
                    {
                        return AuxSecSurf.Size;
                    }
                    else
                    {
                        return (AuxSurf.UnpaddedSize);
                    }
                }
                else if (GmmAuxType == GMM_AUX_COMP_STATE)
                {
                    return GMM_MEDIA_COMPRESSION_STATE_SIZE;
                }
                else if (GmmAuxType == GMM_AUX_CC)
                {
                    if (!Surf.Flags.Gpu.UnifiedAuxSurface && Surf.Flags.Gpu.HiZ)
                    {
                        return GMM_HIZ_CLEAR_COLOR_SIZE;
                    }
                    else
                    {
                    
                        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
                        {
                            if (Surf.MSAA.NumSamples > 1)
                            {
                                return (AuxSurf.UnpaddedSize); // CC is part of MCS
                            }
                            else
                            {
                                return 0; // fixed CC values used, not stored as part of Aux
                            }
                        }
                        else
                        {
                            return (AuxSurf.CCSize);
                        }										
                    }
                }
                else if (GmmAuxType == GMM_AUX_ZCS)
                {
                    if (Surf.Flags.Gpu.UnifiedAuxSurface && AuxSecSurf.Type != RESOURCE_INVALID)
                    {
                        return AuxSecSurf.Size;
                    }
                    else
                    {
                        return 0;
                    }
                }
                else
                {
                    return 0;
                }
            }